

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlRpcSocket.cpp
# Opt level: O1

bool XmlRpc::XmlRpcSocket::nbRead(int fd,string *s,bool *eof)

{
  int iVar1;
  bool bVar2;
  ssize_t sVar3;
  int *piVar4;
  bool bVar5;
  uint uVar6;
  double __x;
  char readBuf [4096];
  undefined1 auStack_1038 [4104];
  
  *eof = false;
  bVar5 = false;
  do {
    if (bVar5) {
      return true;
    }
    if (*eof != false) {
      return true;
    }
    sVar3 = ::read(fd,auStack_1038,0xfff);
    XmlRpcUtil::log(__x);
    uVar6 = (uint)sVar3;
    if ((int)uVar6 < 1) {
      if (uVar6 == 0) {
        *eof = true;
        goto LAB_0024e51e;
      }
      piVar4 = __errno_location();
      iVar1 = *piVar4;
      bVar2 = true;
      if (((iVar1 != 4) && (iVar1 != 0xb)) && (iVar1 != 0x73)) {
        bVar2 = false;
      }
      if (bVar2) {
        bVar5 = true;
      }
    }
    else {
      auStack_1038[uVar6 & 0x7fffffff] = 0;
      std::__cxx11::string::append((char *)s,(ulong)auStack_1038);
LAB_0024e51e:
      bVar2 = true;
    }
    if (!bVar2) {
      return false;
    }
  } while( true );
}

Assistant:

bool XmlRpcSocket::nbRead(int fd, std::string& s, bool *eof)
{
  const int READ_SIZE = 4096;   // Number of bytes to attempt to read at a time
  char readBuf[READ_SIZE];

  bool wouldBlock = false;
  *eof = false;

  while ( ! wouldBlock && ! *eof) {
#if defined(_WIN32)
    int n = recv(fd, readBuf, READ_SIZE-1, 0);
#else
    int n = read(fd, readBuf, READ_SIZE-1);
#endif
    XmlRpcUtil::log(5, "XmlRpcSocket::nbRead: read/recv returned %d.", n);

    if (n > 0) {
      readBuf[n] = 0;
      s.append(readBuf, n);
    } else if (n == 0) {
      *eof = true;
    } else if (nonFatalError()) {
      wouldBlock = true;
    } else {
      return false;   // Error
    }
  }
  return true;
}